

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example-misc.cc
# Opt level: O1

void demo_tmpfile(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  double dVar2;
  ostream *poVar3;
  double y;
  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> xy_pts_B;
  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> xy_pts_A;
  Gnuplot gp;
  string local_2b8;
  string local_298;
  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> local_278;
  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> local_258;
  double local_238;
  double local_230;
  string local_228;
  string local_208;
  undefined1 local_1e8 [456];
  
  paVar1 = &local_2b8.field_2;
  local_2b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"");
  gnuplotio::Gnuplot::Gnuplot((Gnuplot *)local_1e8,&local_2b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
  }
  local_258.
  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  local_258.
  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  local_258.
  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2b8._M_dataplus._M_p = (char *)0xc000000000000000;
  do {
    local_298._M_dataplus._M_p =
         (pointer)((double)local_2b8._M_dataplus._M_p * (double)local_2b8._M_dataplus._M_p *
                  local_2b8._M_dataplus._M_p);
    std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>::
    emplace_back<double&,double&>
              ((vector<std::pair<double,double>,std::allocator<std::pair<double,double>>> *)
               &local_258,(double *)&local_2b8,(double *)&local_298);
    local_2b8._M_dataplus._M_p = (pointer)(local_2b8._M_dataplus._M_p + 0.01);
  } while ((double)local_2b8._M_dataplus._M_p < 2.0);
  local_278.
  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  local_278.
  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  local_278.
  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  dVar2 = 0.0;
  do {
    local_230 = (dVar2 + dVar2) * 3.14159;
    local_238 = dVar2;
    local_2b8._M_dataplus._M_p = (pointer)cos(local_230);
    local_298._M_dataplus._M_p = (pointer)sin(local_230);
    std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>::
    emplace_back<double,double>
              ((vector<std::pair<double,double>,std::allocator<std::pair<double,double>>> *)
               &local_278,(double *)&local_2b8,(double *)&local_298);
    dVar2 = local_238 + 0.041666666666666664;
  } while (dVar2 < 1.0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1e8,"set xrange [-2:2]\nset yrange [-2:2]\n",0x24);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"plot",4);
  local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"");
  gnuplotio::Gnuplot::
  file1d<std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>>
            (&local_2b8,(Gnuplot *)local_1e8,&local_258,&local_298);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1e8,local_2b8._M_dataplus._M_p,local_2b8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"with lines title \'cubic\',",0x19);
  local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"");
  gnuplotio::Gnuplot::
  file1d<std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>>
            (&local_208,(Gnuplot *)local_1e8,&local_278,&local_228);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,local_208._M_dataplus._M_p,local_208._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"with points title \'circle\'",0x1a);
  std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
  }
  if (local_278.
      super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.
                    super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.
                          super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.
                          super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_258.
      super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_258.
                    super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_258.
                          super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_258.
                          super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  gnuplotio::Gnuplot::~Gnuplot((Gnuplot *)local_1e8,&gnuplotio::Gnuplot::VTT);
  std::ios_base::~ios_base((ios_base *)(local_1e8 + 0xc0));
  return;
}

Assistant:

std::vector<std::tuple<double, double, double>> get_trefoil() {
    std::vector<std::tuple<double, double, double>> vecs;
    for(double alpha=0; alpha<1; alpha+=1.0/120.0) {
        double theta = alpha*2.0*3.14159;
        vecs.emplace_back(
            (2+cos(3*theta))*cos(2*theta),
            (2+cos(3*theta))*sin(2*theta),
            sin(3*theta)
        );
    }
    return vecs;
}